

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ecatDemoCommon.cpp
# Opt level: O0

EC_T_CHAR * SlaveProdCodeText(T_eEtherCAT_Vendor EV,T_eEtherCAT_ProductCode EPC)

{
  char *local_18;
  EC_T_CHAR *pRet;
  T_eEtherCAT_ProductCode EPC_local;
  T_eEtherCAT_Vendor EV_local;
  
  if (EV == ecvendor_parker) {
    if (EPC == ecprodcode_par_drive) {
      local_18 = "Drive";
    }
    else {
      local_18 = "Unknown";
    }
  }
  else if (EV == ecvendor_beckhoff) {
    if (EPC == ecprodcode_beck_EL1002) {
      local_18 = "EL1002";
    }
    else if (EPC == ecprodcode_beck_EL1004) {
      local_18 = "EL1004";
    }
    else if (EPC == ecprodcode_beck_EL1008) {
      local_18 = "EL1008";
    }
    else if (EPC == ecprodcode_beck_EL1012) {
      local_18 = "EL1012";
    }
    else if (EPC == ecprodcode_beck_EL1014) {
      local_18 = "EL1014";
    }
    else if (EPC == ecprodcode_beck_EL1018) {
      local_18 = "EL1018";
    }
    else if (EPC == ecprodcode_beck_EL1034) {
      local_18 = "EL1034";
    }
    else if (EPC == ecprodcode_beck_EL1094) {
      local_18 = "EL1094";
    }
    else if (EPC == ecprodcode_beck_EK1100) {
      local_18 = "EK1100";
    }
    else if (EPC == ecprodcode_beck_CX1100_0004) {
      local_18 = "CX1100 0004";
    }
    else if (EPC == ecprodcode_beck_EK1101) {
      local_18 = "EK1101";
    }
    else if (EPC == ecprodcode_beck_EK1110) {
      local_18 = "EK1110";
    }
    else if (EPC == ecprodcode_beck_EL9820) {
      local_18 = "EL9820";
    }
    else if (EPC == ecprodcode_beck_BK1120) {
      local_18 = "BK1120";
    }
    else if (EPC == ecprodcode_beck_EK1122) {
      local_18 = "EK1122";
    }
    else if (EPC == ecprodcode_beck_CU1128) {
      local_18 = "CU1128";
    }
    else if (EPC == ecprodcode_beck_EL1252) {
      local_18 = "EL1252";
    }
    else if (EPC == ecprodcode_beck_EL1259) {
      local_18 = "EL1259";
    }
    else if (EPC == ecprodcode_beck_EL1262) {
      local_18 = "EL1262";
    }
    else if (EPC == ecprodcode_beck_EK1814) {
      local_18 = "EK1814";
    }
    else if (EPC == ecprodcode_beck_EK1818) {
      local_18 = "EK1818";
    }
    else if (EPC == ecprodcode_beck_EK1828) {
      local_18 = "EK1828";
    }
    else if (EPC == ecprodcode_beck_EL1889) {
      local_18 = "EL1889";
    }
    else if (EPC == ecprodcode_beck_EL1904) {
      local_18 = "EL1904";
    }
    else if (EPC == ecprodcode_beck_EK1914) {
      local_18 = "EK1914";
    }
    else if (EPC == ecprodcode_beck_AX2000_B110) {
      local_18 = "AX2000";
    }
    else if (EPC == ecprodcode_beck_EL2002) {
      local_18 = "EL2002";
    }
    else if (EPC == ecprodcode_beck_EL2004) {
      local_18 = "EL2004";
    }
    else if (EPC == ecprodcode_beck_EL2008) {
      local_18 = "EL2008";
    }
    else if (EPC == ecprodcode_beck_EL2032) {
      local_18 = "EL2032";
    }
    else if (EPC == ecprodcode_beck_EL2252) {
      local_18 = "EL2252";
    }
    else if (EPC == ecprodcode_beck_EL2262) {
      local_18 = "EL2262";
    }
    else if (EPC == ecprodcode_beck_EL2502) {
      local_18 = "EL2502";
    }
    else if (EPC == ecprodcode_beck_EL2521) {
      local_18 = "EL2521";
    }
    else if (EPC == ecprodcode_beck_EL2889) {
      local_18 = "EL2889";
    }
    else if (EPC == ecprodcode_beck_EL2904) {
      local_18 = "EL2904";
    }
    else if (EPC == ecprodcode_beck_EL3102) {
      local_18 = "EL3102";
    }
    else if (EPC == ecprodcode_beck_EL3112) {
      local_18 = "EL3112";
    }
    else if (EPC == ecprodcode_beck_EL3122) {
      local_18 = "EL3122";
    }
    else if (EPC == ecprodcode_beck_EL3142) {
      local_18 = "EL3142";
    }
    else if (EPC == ecprodcode_beck_EL3152) {
      local_18 = "EL3152";
    }
    else if (EPC == ecprodcode_beck_EL3162) {
      local_18 = "EL3162";
    }
    else if (EPC == ecprodcode_beck_EL3202) {
      local_18 = "EL3202";
    }
    else if (EPC == ecprodcode_beck_EL3312) {
      local_18 = "EL3312";
    }
    else if (EPC == ecprodcode_beck_EL3356) {
      local_18 = "EL3356";
    }
    else if (EPC == ecprodcode_beck_EL3702) {
      local_18 = "EL3702";
    }
    else if (EPC == ecprodcode_beck_EL4002) {
      local_18 = "EL4002";
    }
    else if (EPC == ecprodcode_beck_EL4102) {
      local_18 = "EL4102";
    }
    else if (EPC == ecprodcode_beck_EL4112) {
      local_18 = "EL4112";
    }
    else if (EPC == ecprodcode_beck_EL4122) {
      local_18 = "EL4122";
    }
    else if (EPC == ecprodcode_beck_EL4132) {
      local_18 = "EL4132";
    }
    else if (EPC == ecprodcode_beck_EL5001) {
      local_18 = "EL5001";
    }
    else if (EPC == ecprodcode_beck_FM5001) {
      local_18 = "FM5001";
    }
    else if (EPC == ecprodcode_beck_EL5101) {
      local_18 = "EL5101";
    }
    else if (EPC == ecprodcode_beck_EL5151) {
      local_18 = "EL5151";
    }
    else if (EPC == ecprodcode_beck_EL5152) {
      local_18 = "EL5152";
    }
    else if (EPC == ecprodcode_beck_EL6001) {
      local_18 = "EL6001";
    }
    else if (EPC == ecprodcode_beck_EL6021) {
      local_18 = "EL6021";
    }
    else if (EPC == ecprodcode_beck_EL6601) {
      local_18 = "EL6601";
    }
    else if (EPC == ecprodcode_beck_EL6614) {
      local_18 = "EL6614";
    }
    else if (EPC == ecprodcode_beck_EL6690) {
      local_18 = "EL6690";
    }
    else if (EPC == ecprodcode_beck_EL6731) {
      local_18 = "EL6731";
    }
    else if (EPC == ecprodcode_beck_EL6751) {
      local_18 = "EL6751";
    }
    else if (EPC == ecprodcode_beck_EL6752) {
      local_18 = "EL6752";
    }
    else if (EPC == ecprodcode_beck_EL6900) {
      local_18 = "EL6900";
    }
    else if (EPC == ecprodcode_beck_EL6930) {
      local_18 = "EL6930";
    }
    else if (EPC == ecprodcode_beck_EL9505) {
      local_18 = "EL9505";
    }
    else if (EPC == ecprodcode_beck_EL9510) {
      local_18 = "EL9510";
    }
    else if (EPC == ecprodcode_beck_EL9512) {
      local_18 = "EL9512";
    }
    else if (EPC == ecprodcode_beck_EL9800) {
      local_18 = "EL9800";
    }
    else {
      local_18 = "Unknown";
    }
  }
  else if (EV == ecvendor_scuola_superiore_s_anna) {
    local_18 = "Unknown";
  }
  else if (EV == ecvendor_ixxat) {
    if (EPC == ecprodcode_ixx_iem) {
      local_18 = "IEM";
    }
    else if (EPC == ecprodcode_ixx_ETCio100) {
      local_18 = "ETCio 100";
    }
    else {
      local_18 = "Unknown";
    }
  }
  else if (EV == ecvendor_pollmeier) {
    if (EPC == ecprodcode_esr_Midi) {
      local_18 = "MidiDrive";
    }
    else if ((EPC == ecprodcode_esr_Trio) || (EPC == ecprodcode_esr_Trio_1)) {
      local_18 = "TrioDrive";
    }
    else {
      local_18 = "Unknown";
    }
  }
  else if (EV == ecvendor_lust) {
    local_18 = "Unknown";
  }
  else if (EV == ecvendor_kuebler) {
    if (EPC == ecprodcode_kuebler_Multiturn5868) {
      local_18 = "Multiturn 5868";
    }
    else {
      local_18 = "Unknown";
    }
  }
  else if (EV == ecvendor_keb) {
    if (EPC == ecprodcode_keb_KEB1736F5_3d) {
      local_18 = "KEB1736F5 3.d";
    }
    else if (EPC == ecprodcode_keb_EcatGateway) {
      local_18 = "KEB ECAT Gateway";
    }
    else {
      local_18 = "Unknown";
    }
  }
  else if (EV == ecvendor_festo) {
    if (EPC == ecprodcode_fst_cpx) {
      local_18 = "CPX";
    }
    else {
      local_18 = "Unknown";
    }
  }
  else if (EV == ecvendor_moog) {
    if (EPC == ecprodcode_ixx_iem) {
      local_18 = "Analogue In";
    }
    else if (EPC == ecprodcode_moog_ServoValveD671) {
      local_18 = "Servo Valve D671";
    }
    else {
      local_18 = "Unknown";
    }
  }
  else if (EV == ecvendor_lenze) {
    if (EPC == ecprodcode_ixx_iem) {
      local_18 = "EL9400 L-Force Servo Drive";
    }
    else if (EPC == ecprodcode_idam_DSMRW) {
      local_18 = "E94AYCET L-Force Servo Drive";
    }
    else if (EPC == ecprodcode_ldc_servogun2) {
      local_18 = "2 Axis Servo Gun";
    }
    else if (EPC == ecprodcode_ldc_servogun3) {
      local_18 = "3 Axis Servo Gun";
    }
    else if (EPC == ecprodcode_ldc_epms130) {
      local_18 = "EPM-S130";
    }
    else if (EPC == ecprodcode_ldc_el8400) {
      local_18 = "EL8400 L-Force Servo Drive";
    }
    else if (EPC == ecprodcode_ldc_stateline) {
      local_18 = "Stateline L-Force Servo Drive";
    }
    else {
      local_18 = "Unknown";
    }
  }
  else if (EV == ecvendor_hilscher) {
    if (EPC == ecprodcode_hil_NXSB100) {
      local_18 = "NX SB100";
    }
    else if (EPC == ecprodcode_hil_NXSB100DC) {
      local_18 = "NX SB100 DC";
    }
    else {
      local_18 = "Unknown";
    }
  }
  else if (EV == ecvendor_komax) {
    if (EPC == ecprodcode_sh_ACSE) {
      local_18 = "ACSE";
    }
    else {
      local_18 = "Unknown";
    }
  }
  else if (EV == ecvendor_sew_eurodrive) {
    if (EPC == ecprodcode_ixx_iem) {
      local_18 = "Movi Drive";
    }
    else if (EPC == ecprodcode_sew_moviaxis) {
      local_18 = "Movi Axis";
    }
    else {
      local_18 = "Unknown";
    }
  }
  else if (EV == ecvendor_danaher) {
    if (EPC == ecprodcode_dan_servostar300) {
      local_18 = "ServoStar 300";
    }
    else {
      local_18 = "Unknown";
    }
  }
  else if (EV == ecvendor_copley) {
    if (EPC == ecprodcode_cpl_accelnet) {
      local_18 = "Accelnet Servo Drive";
    }
    else {
      local_18 = "Unknown";
    }
  }
  else if (EV == ecvendor_controltechniques) {
    if (EPC == ecprodcode_ct_drive) {
      local_18 = "Emerson Drive";
    }
    else if (EPC == ecprodcode_ct_drive_sp) {
      local_18 = "Emerson Drive SP";
    }
    else {
      local_18 = "Unknown";
    }
  }
  else if (EV == ecvendor_smc) {
    if (EPC == ecprodcode_smc_serifcunit) {
      local_18 = "Serif C Unit";
    }
    else {
      local_18 = "Unknown";
    }
  }
  else if (EV == ecvendor_jumo) {
    if (EPC == ecprodcode_jumo_Basis) {
      local_18 = "Basismodul";
    }
    else if (EPC == ecprodcode_jumo_Router) {
      local_18 = "Router";
    }
    else if (EPC == ecprodcode_jumo_Busskoppler) {
      local_18 = "Busskoppler";
    }
    else if (EPC == ecprodcode_jumo_RELAIS) {
      local_18 = "Relais";
    }
    else if (EPC == ecprodcode_jumo_HMI) {
      local_18 = "HMI";
    }
    else if (EPC == ecprodcode_jumo_Analog_4_Ein) {
      local_18 = "4 x Analog Eingang";
    }
    else if (EPC == ecprodcode_jumo_BIO) {
      local_18 = "Basic I/O";
    }
    else if (EPC == ecprodcode_jumo_Analog_8_Ein) {
      local_18 = "8 x Analog Eingang";
    }
    else if (EPC == ecprodcode_jumo_REGLER) {
      local_18 = "Regler";
    }
    else if (EPC == ecprodcode_jumo_Analog_4_Aus) {
      local_18 = "4 x Analog Ausgang";
    }
    else if (EPC == ecprodcode_jumo_Analog_8_Aus) {
      local_18 = "8 x Analog Ausgang";
    }
    else {
      local_18 = "Unknown";
    }
  }
  else if (EV == ecvendor_baumueller) {
    if (EPC == ecprodcode_baumueller_BM4000) {
      local_18 = "BM4000";
    }
    else if (EPC == ecprodcode_baumueller_BM3000) {
      local_18 = "BM3000";
    }
    else {
      local_18 = "Unknown";
    }
  }
  else if (EV == ecvendor_deutschmann) {
    if (EPC == ecprodcode_beck_EL9800) {
      local_18 = "RS232 Gateway";
    }
    else {
      local_18 = "Unknown";
    }
  }
  else if (EV == ecvendor_robox) {
    if (EPC == ecprodcode_rx_coedrivegw) {
      local_18 = "CoE Drive Gateway";
    }
    else {
      local_18 = "Unknown";
    }
  }
  else if (EV == ecvendor_national_instruments) {
    if (EPC == ecprodcode_ni_digio) {
      local_18 = "Digital I/O";
    }
    else if (EPC == ecprodcode_ni_anaio) {
      local_18 = "Analog I/O";
    }
    else {
      local_18 = "Unknown";
    }
  }
  else if (EV == ecvendor_idam) {
    if (EPC == ecprodcode_idam_DSMRW) {
      local_18 = "DSMRW";
    }
    else {
      local_18 = "Unknown";
    }
  }
  else if (EV == ecvendor_baumer_th) {
    local_18 = "Unknown";
  }
  else if (EV == ecvendor_tr) {
    if (EPC == ecprodcode_tr_linencoder2) {
      local_18 = "Line Encoder 2";
    }
    else {
      local_18 = "Unknown";
    }
  }
  else if (EV == ecvendor_bce) {
    if (EPC == ecprodcode_bce_AMAT_Handbox) {
      local_18 = "AMAT Handbox";
    }
    else if (EPC == ecprodcode_bce_AMAT_HB_digout) {
      local_18 = "AMAT Handbox Digital Out";
    }
    else if (EPC == ecprodcode_bce_AMAT_HB_digin) {
      local_18 = "AMAT Handbox Digital In";
    }
    else {
      local_18 = "Unknown";
    }
  }
  else if (EV == ecvendor_dresdenelektronik) {
    if (EPC == ecprodcode_de_sdac3100) {
      local_18 = "de axis controller 3100";
    }
    else {
      local_18 = "Unknown";
    }
  }
  else if (EV == ecvendor_yaskawa) {
    if (EPC == ecprodcode_yas_sgdv_e1) {
      local_18 = "SGDV-E1 CoE Drive";
    }
    else {
      local_18 = "Unknown";
    }
  }
  else if (EV == ecvendor_renesas) {
    if (EPC == ecprodcode_ren_EC1) {
      local_18 = "EC-1";
    }
    else {
      local_18 = "Unknown";
    }
  }
  else if (EV == ecvendor_koenig) {
    if (EPC == ecprodcode_kng_pc104) {
      local_18 = "PC104";
    }
    else {
      local_18 = "Unknown";
    }
  }
  else if (EV == ecvendor_acontis) {
    if (EPC == ecprodcode_at_atemTestSlave) {
      local_18 = "EtherCAT TestSlave";
    }
    else if (EPC == ecprodcode_at_atem) {
      local_18 = "EtherCAT Master";
    }
    else {
      local_18 = "Unknown";
    }
  }
  else if (EV == ecvendor_kuka) {
    if (EPC == ecprodcode_ixx_iem) {
      local_18 = "CIB";
    }
    else if (EPC == ecprodcode_bce_AMAT_HB_digin) {
      local_18 = "RDC 3 angle resolver";
    }
    else if (EPC == ecprodcode_kr_cibsion) {
      local_18 = "CIB-SION";
    }
    else if (EPC == ecprodcode_kr_sionkpp) {
      local_18 = "SION-KPP";
    }
    else if (EPC == ecprodcode_kr_sionksp) {
      local_18 = "SION-KSP";
    }
    else {
      local_18 = "Unknown";
    }
  }
  else if (EV == ecvendor_kuhnke) {
    if (EPC == ecprodcode_kuh_VFIO_BK) {
      local_18 = "BK";
    }
    else if (EPC == ecprodcode_kuh_VFIO_DIO) {
      local_18 = "Digital I/O";
    }
    else {
      local_18 = "Unknown";
    }
  }
  else if (EV == ecvendor_jat) {
    if (EPC == ecprodcode_ixx_iem) {
      local_18 = "Drive";
    }
    else {
      local_18 = "Unknown";
    }
  }
  else if ((EV & 0xe0000000) == 0xe0000000) {
    local_18 = SlaveProdCodeText(EV & 0x1fffffff,EPC);
  }
  else {
    local_18 = "Unknown";
  }
  return local_18;
}

Assistant:

EC_T_CHAR* SlaveProdCodeText(
    T_eEtherCAT_Vendor      EV,     /**< [in]   Vendor ID */
    T_eEtherCAT_ProductCode EPC     /**< [in]   Product Code */
)
{
    EC_T_CHAR* pRet = EC_NULL;

    switch (EV)
    {
    case ecvendor_beckhoff:
        {
            switch (EPC)
            {
            case ecprodcode_beck_AX2000_B110:   pRet  = (EC_T_CHAR*)"AX2000"; break;
         /* case ecprodcode_beck_AX2000_B110:   pRet  = (EC_T_CHAR*)"AX2000 B110"; break; */
         /* case ecprodcode_beck_AX2000_B120:   pRet  = (EC_T_CHAR*)"AX2000 B120"; break; */
            case ecprodcode_beck_BK1120:        pRet  = (EC_T_CHAR*)"BK1120"; break;
            case ecprodcode_beck_CX1100_0004:   pRet  = (EC_T_CHAR*)"CX1100 0004"; break;
            case ecprodcode_beck_CU1128:        pRet  = (EC_T_CHAR*)"CU1128"; break;
            case ecprodcode_beck_EK1100:        pRet  = (EC_T_CHAR*)"EK1100"; break;
            case ecprodcode_beck_EK1101:        pRet  = (EC_T_CHAR*)"EK1101"; break;
            case ecprodcode_beck_EK1110:        pRet  = (EC_T_CHAR*)"EK1110"; break;
            case ecprodcode_beck_EK1122:        pRet  = (EC_T_CHAR*)"EK1122"; break;
            case ecprodcode_beck_EK1814:        pRet  = (EC_T_CHAR*)"EK1814"; break;
            case ecprodcode_beck_EK1818:        pRet  = (EC_T_CHAR*)"EK1818"; break;
            case ecprodcode_beck_EK1828:        pRet  = (EC_T_CHAR*)"EK1828"; break;
            case ecprodcode_beck_EK1914:        pRet  = (EC_T_CHAR*)"EK1914"; break;
            case ecprodcode_beck_EL1002:        pRet  = (EC_T_CHAR*)"EL1002"; break;
            case ecprodcode_beck_EL1004:        pRet  = (EC_T_CHAR*)"EL1004"; break;
         /* case ecprodcode_beck_EL1004_0010:   pRet  = (EC_T_CHAR*)"EL1004 0010"; break; */
            case ecprodcode_beck_EL1008:        pRet  = (EC_T_CHAR*)"EL1008"; break;
            case ecprodcode_beck_EL1012:        pRet  = (EC_T_CHAR*)"EL1012"; break;
            case ecprodcode_beck_EL1014:        pRet  = (EC_T_CHAR*)"EL1014"; break;
         /* case ecprodcode_beck_EL1014_0010:   pRet  = (EC_T_CHAR*)"EL1014 0010"; break; */
            case ecprodcode_beck_EL1018:        pRet  = (EC_T_CHAR*)"EL1018"; break;
            case ecprodcode_beck_EL1034:        pRet  = (EC_T_CHAR*)"EL1034"; break;
            case ecprodcode_beck_EL1094:        pRet  = (EC_T_CHAR*)"EL1094"; break;
            case ecprodcode_beck_EL1252:        pRet  = (EC_T_CHAR*)"EL1252"; break;
            case ecprodcode_beck_EL1259:        pRet  = (EC_T_CHAR*)"EL1259"; break;
            case ecprodcode_beck_EL1262:        pRet  = (EC_T_CHAR*)"EL1262"; break;
            case ecprodcode_beck_EL1904:        pRet  = (EC_T_CHAR*)"EL1904"; break;
            case ecprodcode_beck_EL1889:        pRet  = (EC_T_CHAR*)"EL1889"; break;

            case ecprodcode_beck_EL2002:        pRet  = (EC_T_CHAR*)"EL2002"; break;
            case ecprodcode_beck_EL2004:        pRet  = (EC_T_CHAR*)"EL2004"; break;
            case ecprodcode_beck_EL2008:        pRet  = (EC_T_CHAR*)"EL2008"; break;
            case ecprodcode_beck_EL2032:        pRet  = (EC_T_CHAR*)"EL2032"; break;
            case ecprodcode_beck_EL2262:        pRet  = (EC_T_CHAR*)"EL2262"; break;
            case ecprodcode_beck_EL2252:        pRet  = (EC_T_CHAR*)"EL2252"; break;
            case ecprodcode_beck_EL2502:        pRet  = (EC_T_CHAR*)"EL2502"; break;
            case ecprodcode_beck_EL2521:        pRet  = (EC_T_CHAR*)"EL2521"; break;
         /* case ecprodcode_beck_EL2521_1001:   pRet  = (EC_T_CHAR*)"EL2521 0001"; break; */
            case ecprodcode_beck_EL2889:        pRet  = (EC_T_CHAR*)"EL2889"; break;
            case ecprodcode_beck_EL2904:        pRet  = (EC_T_CHAR*)"EL2904"; break;
            case ecprodcode_beck_EL3102:        pRet  = (EC_T_CHAR*)"EL3102"; break;
            case ecprodcode_beck_EL3112:        pRet  = (EC_T_CHAR*)"EL3112"; break;
            case ecprodcode_beck_EL3122:        pRet  = (EC_T_CHAR*)"EL3122"; break;
            case ecprodcode_beck_EL3142:        pRet  = (EC_T_CHAR*)"EL3142"; break;
         /* case ecprodcode_beck_EL3142_0010:   pRet  = (EC_T_CHAR*)"EL3142 0010"; break; */
            case ecprodcode_beck_EL3152:        pRet  = (EC_T_CHAR*)"EL3152"; break;
            case ecprodcode_beck_EL3162:        pRet  = (EC_T_CHAR*)"EL3162"; break;
            case ecprodcode_beck_EL3202:        pRet  = (EC_T_CHAR*)"EL3202"; break;
            case ecprodcode_beck_EL3312:        pRet  = (EC_T_CHAR*)"EL3312"; break;
            case ecprodcode_beck_EL3356:        pRet  = (EC_T_CHAR*)"EL3356"; break;
            case ecprodcode_beck_EL3702:        pRet  = (EC_T_CHAR*)"EL3702"; break;
            case ecprodcode_beck_EL4002:        pRet  = (EC_T_CHAR*)"EL4002"; break;
            case ecprodcode_beck_EL4102:        pRet  = (EC_T_CHAR*)"EL4102"; break;
            case ecprodcode_beck_EL4112:        pRet  = (EC_T_CHAR*)"EL4112"; break;
         /* case ecprodcode_beck_EL4112_0010:   pRet  = (EC_T_CHAR*)"EL4112 0010"; break; */
            case ecprodcode_beck_EL4122:        pRet  = (EC_T_CHAR*)"EL4122"; break;
            case ecprodcode_beck_EL4132:        pRet  = (EC_T_CHAR*)"EL4132"; break;
            case ecprodcode_beck_EL5001:        pRet  = (EC_T_CHAR*)"EL5001"; break;
            case ecprodcode_beck_EL5101:        pRet  = (EC_T_CHAR*)"EL5101"; break;
            case ecprodcode_beck_EL5151:        pRet  = (EC_T_CHAR*)"EL5151"; break;
            case ecprodcode_beck_EL5152:        pRet  = (EC_T_CHAR*)"EL5152"; break;
            case ecprodcode_beck_EL6001:        pRet  = (EC_T_CHAR*)"EL6001"; break;
            case ecprodcode_beck_EL6021:        pRet  = (EC_T_CHAR*)"EL6021"; break;
            case ecprodcode_beck_EL6601:        pRet  = (EC_T_CHAR*)"EL6601"; break;
            case ecprodcode_beck_EL6614:        pRet  = (EC_T_CHAR*)"EL6614"; break;
            case ecprodcode_beck_EL6690:        pRet  = (EC_T_CHAR*)"EL6690"; break;
            case ecprodcode_beck_EL6731:        pRet  = (EC_T_CHAR*)"EL6731"; break;
         /* case ecprodcode_beck_EL6731_0010:   pRet  = (EC_T_CHAR*)"EL6731 0010"; break; */
            case ecprodcode_beck_EL6751:        pRet  = (EC_T_CHAR*)"EL6751"; break;
            case ecprodcode_beck_EL6752:        pRet  = (EC_T_CHAR*)"EL6752"; break;

            case ecprodcode_beck_EL6900:        pRet  = (EC_T_CHAR*)"EL6900"; break;
            case ecprodcode_beck_EL6930:        pRet  = (EC_T_CHAR*)"EL6930"; break;
            case ecprodcode_beck_EL9505:        pRet  = (EC_T_CHAR*)"EL9505"; break;
            case ecprodcode_beck_EL9510:        pRet  = (EC_T_CHAR*)"EL9510"; break;
            case ecprodcode_beck_EL9512:        pRet  = (EC_T_CHAR*)"EL9512"; break;
            case ecprodcode_beck_EL9800:        pRet  = (EC_T_CHAR*)"EL9800"; break;
            case ecprodcode_beck_EL9820:        pRet  = (EC_T_CHAR*)"EL9820"; break;
            case ecprodcode_beck_FM5001:        pRet  = (EC_T_CHAR*)"FM5001"; break;

            default:                            pRet  = (EC_T_CHAR*)"Unknown"; break;
            }
        } break;
#if !(defined EC_DEMO_TINY)
    case ecvendor_scuola_superiore_s_anna:
        {
            pRet  = (EC_T_CHAR*)"Unknown";
        } break;
    case ecvendor_ixxat:
        {
            switch (EPC)
            {
            case ecprodcode_ixx_iem:            pRet  = (EC_T_CHAR*)"IEM"; break;
            case ecprodcode_ixx_ETCio100:       pRet  = (EC_T_CHAR*)"ETCio 100"; break;
            default:                            pRet  = (EC_T_CHAR*)"Unknown"; break;
            }
        } break;
    case ecvendor_pollmeier:
        {
            switch (EPC)
            {
            case ecprodcode_esr_Trio_1:
            case ecprodcode_esr_Trio:           pRet  = (EC_T_CHAR*)"TrioDrive"; break;
            case ecprodcode_esr_Midi:           pRet  = (EC_T_CHAR*)"MidiDrive"; break;
            default:                            pRet  = (EC_T_CHAR*)"Unknown"; break;
            }
        } break;
    case ecvendor_lust:
        {
            pRet  = (EC_T_CHAR*)"Unknown";
        } break;
    case ecvendor_kuebler:
        {
            switch (EPC)
            {
            case ecprodcode_kuebler_Multiturn5868:
                pRet  = (EC_T_CHAR*)"Multiturn 5868"; break;
            default:                            pRet  = (EC_T_CHAR*)"Unknown"; break;
            }
        } break;
    case ecvendor_keb:
        {
            switch (EPC)
            {
            case ecprodcode_keb_KEB1736F5_3d:   pRet  = (EC_T_CHAR*)"KEB1736F5 3.d"; break;
            case ecprodcode_keb_EcatGateway:    pRet  = (EC_T_CHAR*)"KEB ECAT Gateway"; break;
            default:                            pRet  = (EC_T_CHAR*)"Unknown"; break;
            };
        } break;
    case ecvendor_moog:
        {
            switch (EPC)
            {
            case ecprodcode_moog_anin:          pRet  = (EC_T_CHAR*)"Analogue In"; break;
            case ecprodcode_moog_ServoValveD671:pRet  = (EC_T_CHAR*)"Servo Valve D671"; break;
            default:                            pRet  = (EC_T_CHAR*)"Unknown"; break;
            };
        } break;
    case ecvendor_lenze:
        {
            switch (EPC)
            {
            case ecprodcode_ldc_el9400:         pRet  = (EC_T_CHAR*)"EL9400 L-Force Servo Drive"; break;
            case ecprodcode_ldc_e94aycet:       pRet  = (EC_T_CHAR*)"E94AYCET L-Force Servo Drive"; break;
            case ecprodcode_ldc_servogun2:      pRet  = (EC_T_CHAR*)"2 Axis Servo Gun"; break;
            case ecprodcode_ldc_servogun3:      pRet  = (EC_T_CHAR*)"3 Axis Servo Gun"; break;
            case ecprodcode_ldc_epms130:        pRet  = (EC_T_CHAR*)"EPM-S130"; break;
            case ecprodcode_ldc_el8400:         pRet  = (EC_T_CHAR*)"EL8400 L-Force Servo Drive"; break;
            case ecprodcode_ldc_stateline:      pRet  = (EC_T_CHAR*)"Stateline L-Force Servo Drive"; break;
            default:                            pRet  = (EC_T_CHAR*)"Unknown"; break;
            };
        } break;
    case ecvendor_hilscher:
        {
            switch (EPC)
            {
            case ecprodcode_hil_NXSB100:        pRet  = (EC_T_CHAR*)"NX SB100"; break;
            case ecprodcode_hil_NXSB100DC:      pRet  = (EC_T_CHAR*)"NX SB100 DC"; break;
            default:                            pRet  = (EC_T_CHAR*)"Unknown"; break;
            };
        } break;
    case ecvendor_renesas:
        {
            switch (EPC)
            {
            case ecprodcode_ren_EC1:            pRet = (EC_T_CHAR*)"EC-1"; break;
            default:                            pRet = (EC_T_CHAR*)"Unknown"; break;
            };
        } break;
    case ecvendor_komax:
        {
            switch (EPC)
            {
            case ecprodcode_sh_ACSE:            pRet  = (EC_T_CHAR*)"ACSE"; break;
            default:                            pRet  = (EC_T_CHAR*)"Unknown"; break;
            };;
        } break;
    case ecvendor_sew_eurodrive:
        {
            switch (EPC)
            {
            case ecprodcode_sew_movidrive:      pRet  = (EC_T_CHAR*)"Movi Drive"; break;
            case ecprodcode_sew_moviaxis:       pRet  = (EC_T_CHAR*)"Movi Axis"; break;
            default:                            pRet  = (EC_T_CHAR*)"Unknown"; break;
            };
        } break;
    case ecvendor_danaher:
        {
            switch (EPC)
            {
            case ecprodcode_dan_servostar300:   pRet  = (EC_T_CHAR*)"ServoStar 300"; break;
            default:                            pRet  = (EC_T_CHAR*)"Unknown"; break;
            };
        } break;
    case ecvendor_controltechniques:
        {
            switch (EPC)
            {
            case ecprodcode_ct_drive:           pRet  = (EC_T_CHAR*)"Emerson Drive"; break;
            case ecprodcode_ct_drive_sp:        pRet  = (EC_T_CHAR*)"Emerson Drive SP"; break;
            default:                            pRet  = (EC_T_CHAR*)"Unknown"; break;
            };
        } break;
    case ecvendor_smc:
        {
            switch (EPC)
            {
            case ecprodcode_smc_serifcunit:     pRet  = (EC_T_CHAR*)"Serif C Unit"; break;
            default:                            pRet  = (EC_T_CHAR*)"Unknown"; break;
            };
        } break;
    case ecvendor_jumo:
        {
            switch (EPC)
            {
            case ecprodcode_jumo_Basis:         pRet  = (EC_T_CHAR*)"Basismodul"; break;
            case ecprodcode_jumo_Busskoppler:   pRet  = (EC_T_CHAR*)"Busskoppler"; break;
            case ecprodcode_jumo_HMI:           pRet  = (EC_T_CHAR*)"HMI"; break;
            case ecprodcode_jumo_Router:        pRet  = (EC_T_CHAR*)"Router"; break;
            case ecprodcode_jumo_BIO:           pRet  = (EC_T_CHAR*)"Basic I/O"; break;
            case ecprodcode_jumo_RELAIS:        pRet  = (EC_T_CHAR*)"Relais"; break;
            case ecprodcode_jumo_REGLER:        pRet  = (EC_T_CHAR*)"Regler"; break;
            case ecprodcode_jumo_Analog_4_Ein:  pRet  = (EC_T_CHAR*)"4 x Analog Eingang"; break;
            case ecprodcode_jumo_Analog_8_Ein:  pRet  = (EC_T_CHAR*)"8 x Analog Eingang"; break;
            case ecprodcode_jumo_Analog_4_Aus:  pRet  = (EC_T_CHAR*)"4 x Analog Ausgang"; break;
            case ecprodcode_jumo_Analog_8_Aus:  pRet  = (EC_T_CHAR*)"8 x Analog Ausgang"; break;
            default:                            pRet  = (EC_T_CHAR*)"Unknown"; break;
            };
        } break;
    case ecvendor_baumueller:
        {
            switch (EPC)
            {
            case ecprodcode_baumueller_BM3000:  pRet  = (EC_T_CHAR*)"BM3000"; break;
            case ecprodcode_baumueller_BM4000:  pRet  = (EC_T_CHAR*)"BM4000"; break;
            default:                            pRet  = (EC_T_CHAR*)"Unknown"; break;
            };
        } break;
    case ecvendor_deutschmann:
        {
            switch (EPC)
            {
            case ecprodcode_dm_rs232gw:         pRet  = (EC_T_CHAR*)"RS232 Gateway"; break;
            default:                            pRet  = (EC_T_CHAR*)"Unknown"; break;
            };
        } break;
    case ecvendor_parker:
        {
            switch (EPC)
            {
            case ecprodcode_par_drive:          pRet  = (EC_T_CHAR*)"Drive"; break;
            default:                            pRet  = (EC_T_CHAR*)"Unknown"; break;
            };
        } break;
    case ecvendor_national_instruments:
        {
            switch (EPC)
            {
            case ecprodcode_ni_digio:           pRet  = (EC_T_CHAR*)"Digital I/O"; break;
            case ecprodcode_ni_anaio:           pRet  = (EC_T_CHAR*)"Analog I/O"; break;
            default:                            pRet  = (EC_T_CHAR*)"Unknown"; break;
            };
        } break;
    case ecvendor_idam:
        {
            switch (EPC)
            {
            case ecprodcode_idam_DSMRW:         pRet  = (EC_T_CHAR*)"DSMRW"; break;
            default:                            pRet  = (EC_T_CHAR*)"Unknown"; break;
            }
        } break;
    case ecvendor_baumer_th:
        {
            pRet  = (EC_T_CHAR*)"Unknown";
        } break;
    case ecvendor_tr:
        {
            switch (EPC)
            {
            case ecprodcode_tr_linencoder2:     pRet  = (EC_T_CHAR*)"Line Encoder 2"; break;
            default:                            pRet  = (EC_T_CHAR*)"Unknown"; break;
            }
        } break;
    case ecvendor_bce:
        {
            switch (EPC)
            {
            case ecprodcode_bce_AMAT_Handbox:   pRet  = (EC_T_CHAR*)"AMAT Handbox"; break;
            case ecprodcode_bce_AMAT_HB_digin:  pRet  = (EC_T_CHAR*)"AMAT Handbox Digital In"; break;
            case ecprodcode_bce_AMAT_HB_digout: pRet  = (EC_T_CHAR*)"AMAT Handbox Digital Out"; break;
            default:                            pRet  = (EC_T_CHAR*)"Unknown"; break;
            }
        } break;
    case ecvendor_koenig:
        {
            switch (EPC)
            {
            case ecprodcode_kng_pc104:          pRet  = (EC_T_CHAR*)"PC104"; break;
            default:                            pRet  = (EC_T_CHAR*)"Unknown"; break;
            }
        } break;
    case ecvendor_acontis:
        {
            switch (EPC)
            {
            case ecprodcode_at_atem:            pRet  = (EC_T_CHAR*)"EtherCAT Master"; break;
            case ecprodcode_at_atemTestSlave:   pRet  = (EC_T_CHAR*)"EtherCAT TestSlave"; break;
            default:                            pRet  = (EC_T_CHAR*)"Unknown"; break;
            }
        } break;
    case ecvendor_kuka:
        {
            switch (EPC)
            {
            case ecprodcode_kr_cib:             pRet  = (EC_T_CHAR*)"CIB"; break;
            case ecprodcode_kr_rdc3:            pRet  = (EC_T_CHAR*)"RDC 3 angle resolver"; break;
            case ecprodcode_kr_cibsion:         pRet  = (EC_T_CHAR*)"CIB-SION"; break;
            case ecprodcode_kr_sionkpp:         pRet  = (EC_T_CHAR*)"SION-KPP"; break;
            case ecprodcode_kr_sionksp:         pRet  = (EC_T_CHAR*)"SION-KSP"; break;
            default:                            pRet  = (EC_T_CHAR*)"Unknown"; break;
            }
        } break;
    case ecvendor_kuhnke:
        {
            switch (EPC)
            {
            case ecprodcode_kuh_VFIO_BK:        pRet  = (EC_T_CHAR*)"BK"; break;
            case ecprodcode_kuh_VFIO_DIO:       pRet  = (EC_T_CHAR*)"Digital I/O"; break;
            default:                            pRet  = (EC_T_CHAR*)"Unknown"; break;
            }
        } break;
    case ecvendor_jat:
        {
            switch (EPC)
            {
            case ecprodcode_jat_drive1:         pRet  = (EC_T_CHAR*)"Drive"; break;
            default:                            pRet  = (EC_T_CHAR*)"Unknown"; break;
            }
        } break;
    case ecvendor_festo:
        {
            switch (EPC)
            {
            case ecprodcode_fst_cpx:            pRet  = (EC_T_CHAR*)"CPX"; break;
            default:                            pRet  = (EC_T_CHAR*)"Unknown"; break;
            }
        } break;
    case ecvendor_copley:
        {
            switch (EPC)
            {
            case ecprodcode_cpl_accelnet:       pRet  = (EC_T_CHAR*)"Accelnet Servo Drive"; break;
            default:                            pRet  = (EC_T_CHAR*)"Unknown"; break;
            }
        } break;
    case ecvendor_robox:
        {
            switch (EPC)
            {
            case ecprodcode_rx_coedrivegw:      pRet  = (EC_T_CHAR*)"CoE Drive Gateway"; break;
            default:                            pRet  = (EC_T_CHAR*)"Unknown"; break;
            }
        } break;
    case ecvendor_dresdenelektronik:
        {
            switch (EPC)
            {
            case ecprodcode_de_sdac3100:        pRet  = (EC_T_CHAR*)"de axis controller 3100"; break;
            default:                            pRet  = (EC_T_CHAR*)"Unknown"; break;
            };
        } break;
    case ecvendor_yaskawa:
        {
            switch (EPC)
            {
            case ecprodcode_yas_sgdv_e1:        pRet  = (EC_T_CHAR*)"SGDV-E1 CoE Drive"; break;
            default:                            pRet  = (EC_T_CHAR*)"Unknown"; break;
            };
        } break;
#endif /*#if !(defined EC_DEMO_TINY)*/
    default:
        if (0xE0000000 == (((EC_T_DWORD)EV)&0xE0000000))
        {
            pRet = SlaveProdCodeText((T_eEtherCAT_Vendor)(((EC_T_DWORD)EV)&(~0xe0000000)), EPC);
        }
        else
        {
            pRet = (EC_T_CHAR*)"Unknown";
        }
    }

    return pRet;
}